

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_true>::fix_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  int *piVar1;
  pointer pBVar2;
  Bc BVar3;
  pointer pBVar4;
  ulong uVar5;
  ulong uVar6;
  uint block_pos;
  
  block_pos = node_pos >> 8;
  while ((uint)((ulong)((long)(this->blocks_).
                              super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->blocks_).
                             super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) <= block_pos) {
    push_block_(this);
  }
  this->bc_emps_ = this->bc_emps_ - 1;
  piVar1 = (int *)((long)&((blocks->
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                           _M_impl.super__Vector_impl_data._M_start)->num_emps +
                  (ulong)(block_pos << 4));
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    delete_block_link_(this,block_pos,&this->blocks_);
  }
  else {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar3 = pBVar2[node_pos];
    uVar5 = (ulong)BVar3 >> 0x20 & 0x7fffffff;
    uVar6 = (ulong)BVar3 & 0x7fffffff;
    *(int *)(pBVar2 + uVar5) = (int)uVar6;
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[uVar6] = (Bc)((ulong)pBVar2[uVar6] & 0x80000000ffffffff | uVar5 << 0x20);
    pBVar4 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(uint32_t *)((long)&pBVar4->head + (ulong)(block_pos << 4)) == node_pos) {
      *(uint *)((long)&pBVar4->head + (ulong)(block_pos << 4)) = BVar3._0_4_ & 0x7fffffff;
    }
  }
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar2 = (Bc)((ulong)*pBVar2 | 0x8000000000000000);
  return;
}

Assistant:

void fix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (blocks[block_pos].num_emps == 0) {
      delete_block_link_(block_pos, blocks_);
    } else {
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
      if (node_pos == blocks[block_pos].head) {
        blocks[block_pos].head = next;
      }
    }
    bc_[node_pos].fix();
  }